

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.h
# Opt level: O0

void __thiscall
QuickConnection::PacketInfo::PacketInfo
          (PacketInfo *this,uint16_t sequence_number,uint16_t data_len,uint64_t timestamp,
          uint16_t expect_sequence_number,uint16_t packet_number)

{
  uint16_t packet_number_local;
  uint16_t expect_sequence_number_local;
  uint64_t timestamp_local;
  uint16_t data_len_local;
  uint16_t sequence_number_local;
  PacketInfo *this_local;
  
  this->sequence_number = 0;
  this->data_len = 0;
  this->timestamp = 0;
  this->expect_sequence_number = 0;
  this->packet_number = 0;
  this->sequence_number = sequence_number;
  this->data_len = data_len;
  this->timestamp = timestamp;
  this->expect_sequence_number = expect_sequence_number;
  this->packet_number = packet_number;
  return;
}

Assistant:

PacketInfo(uint16_t sequence_number, uint16_t data_len, uint64_t timestamp, uint16_t expect_sequence_number, uint16_t packet_number) {
			this->sequence_number = sequence_number;
			this->data_len = data_len;
			this->timestamp = timestamp;
			this->expect_sequence_number = expect_sequence_number;
			this->packet_number = packet_number;
		}